

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sort1d_ascending(double *v,int N,int *pos)

{
  void *__base;
  int local_2c;
  int i;
  vipair *val;
  int *pos_local;
  int N_local;
  double *v_local;
  
  if (0 < N) {
    __base = malloc((long)N << 4);
    for (local_2c = 0; local_2c < N; local_2c = local_2c + 1) {
      *(double **)((long)__base + (long)local_2c * 0x10) = v + local_2c;
      *(int *)((long)__base + (long)local_2c * 0x10 + 8) = local_2c;
    }
    qsort(__base,(long)N,0x10,compare_ascending);
    for (local_2c = 0; local_2c < N; local_2c = local_2c + 1) {
      pos[local_2c] = *(int *)((long)__base + (long)local_2c * 0x10 + 8);
    }
    free(__base);
  }
  return;
}

Assistant:

void sort1d_ascending(double* v,int N, int* pos)
{
    vipair* val = NULL;
    int i;

    if (N <= 0)
        return;

    val = malloc(sizeof(vipair) * N);

    for (i = 0; i < N; ++i) {
        val[i].a = &v[i];
        val[i].b = i;
    }

    qsort(val, N, sizeof(vipair), compare_ascending);

    for (i = 0; i < N; ++i)
        pos[i] = val[i].b;

    free(val);
}